

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_7f32bc::SF_Crypt::setDecodeParms(SF_Crypt *this,QPDFObjectHandle *decode_parms)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  bVar1 = QPDFObjectHandle::isNull(decode_parms);
  bVar5 = true;
  if (!bVar1) {
    QPDFObjectHandle::getKeys_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_60,decode_parms);
    bVar5 = true;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        iVar3 = std::__cxx11::string::compare((char *)(p_Var4 + 1));
        if (iVar3 == 0) {
LAB_00203ccb:
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/Type","");
          bVar1 = QPDFObjectHandle::hasKey(decode_parms,&local_80);
          bVar2 = true;
          if (bVar1) {
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,"/CryptFilterDecodeParms","");
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
            bVar2 = QPDFObjectHandle::isDictionaryOfType(decode_parms,&local_c0,&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          bVar5 = (bool)(bVar5 & bVar2);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)(p_Var4 + 1));
          if (iVar3 == 0) goto LAB_00203ccb;
          bVar5 = false;
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != &local_60._M_impl.super__Rb_tree_header);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return bVar5;
}

Assistant:

bool
        setDecodeParms(QPDFObjectHandle decode_parms) override
        {
            if (decode_parms.isNull()) {
                return true;
            }
            bool filterable = true;
            for (auto const& key: decode_parms.getKeys()) {
                if (((key == "/Type") || (key == "/Name")) &&
                    ((!decode_parms.hasKey("/Type")) ||
                     decode_parms.isDictionaryOfType("/CryptFilterDecodeParms"))) {
                    // we handle this in decryptStream
                } else {
                    filterable = false;
                }
            }
            return filterable;
        }